

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_0::CWriter::WriteMemory(CWriter *this,string *name,Memory *memory)

{
  char *pcVar1;
  char *pcVar2;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  pcVar2 = "wasm_rt_memory_t";
  if (((ulong)memory & 1) != 0) {
    pcVar2 = "wasm_rt_shared_memory_t";
  }
  pcVar1 = pcVar2 + 0x10;
  if (((ulong)memory & 1) != 0) {
    pcVar1 = pcVar2 + 0x17;
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar2,pcVar1);
  WriteData(this,(char *)local_40,local_38);
  WriteData(this," ",1);
  (anonymous_namespace)::CWriter::Write<std::__cxx11::string_const&,char_const(&)[2]>
            ((CWriter *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (name->_M_dataplus)._M_p,(char (*) [2])name->_M_string_length);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void CWriter::WriteMemory(const std::string& name, const Memory& memory) {
  Write(GetMemoryTypeString(memory), " ", name, ";");
}